

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1010::run(TestCase1010 *this)

{
  TransformPromiseNodeBase *this_00;
  char (*in_RCX) [9];
  Reader value;
  Own<kj::_::PromiseNode> local_388;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_368;
  undefined1 local_358 [40];
  Client cap;
  Array<char> local_318;
  Orphan<capnproto_test::capnp::test::TestTransferCap::Element> orphan;
  BuilderFor<capnproto_test::capnp::test::TestTransferCap::Element> e;
  Builder root;
  EventLoop loop;
  Orphanage local_258;
  MallocMessageBuilder message;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestTransferCap>
            (&root,&message.super_MessageBuilder);
  local_258 = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestTransferCap::Element>(&orphan,&local_258);
  OrphanGetImpl<capnproto_test::capnp::test::TestTransferCap::Element,_(capnp::Kind)3>::apply
            (&e,&orphan.builder);
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestTransferCap::Element::Builder::setText(&e,value);
  kj::_::Debug::makeDescription<char_const(&)[9]>
            ((String *)&local_318,(Debug *)"\"whatever\"","whatever",in_RCX);
  kj::Exception::Exception
            ((Exception *)&local_258,FAILED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x3fc,(String *)&local_318);
  capnproto_test::capnp::test::TestInterface::Client::Client
            ((Client *)local_358,(Exception *)&local_258);
  capnproto_test::capnp::test::TestTransferCap::Element::Builder::setCap(&e,(Client *)local_358);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_358 + 8));
  kj::Exception::~Exception((Exception *)&local_258);
  kj::Array<char>::~Array(&local_318);
  capnproto_test::capnp::test::TestTransferCap::Builder::initList((Builder *)&local_258,&root,1);
  List<capnproto_test::capnp::test::TestTransferCap::Element,_(capnp::Kind)3>::Builder::
  adoptWithCaveats((Builder *)&local_258,0,&orphan);
  capnproto_test::capnp::test::TestTransferCap::Builder::getList((Builder *)local_358,&root);
  ListBuilder::getStructElement((StructBuilder *)&local_258,(ListBuilder *)local_358,0);
  capnproto_test::capnp::test::TestTransferCap::Element::Builder::getCap(&cap,(Builder *)&local_258)
  ;
  Capability::Client::whenResolved((Client *)&local_368);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_368,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:1027:27),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:1029:6)>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006580e0;
  local_358._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase1010::run()::$_0,capnp::_::(anonymous_namespace)::TestCase1010::run()::$_1>>
        ::instance;
  local_258 = (Orphanage)ZEXT816(0x658138);
  local_388.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase1010::run()::$_0,capnp::_::(anonymous_namespace)::TestCase1010::run()::$_1>>
        ::instance;
  local_358._8_8_ = (PromiseNode *)0x0;
  local_388.ptr = (PromiseNode *)this_00;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_358);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_258);
  kj::Promise<void>::wait((Promise<void> *)&local_388,&waitScope);
  kj::Own<kj::_::PromiseNode>::dispose(&local_388);
  kj::Own<kj::_::PromiseNode>::dispose(&local_368);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap.field_0x8);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, TransferCap) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestTransferCap>();

  auto orphan = message.getOrphanage().newOrphan<test::TestTransferCap::Element>();
  auto e = orphan.get();
  e.setText("foo");
  e.setCap(KJ_EXCEPTION(FAILED, "whatever"));

  root.initList(1).adoptWithCaveats(0, kj::mv(orphan));

  // This line used to throw due to capability pointers being incorrectly transferred.
  auto cap = root.getList()[0].getCap();

  cap.whenResolved().then([]() {
    KJ_FAIL_EXPECT("didn't throw?");
  }, [](kj::Exception&&) {
    // success
  }).wait(waitScope);
}